

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O2

uint32_t float_to_uint_int(uint32_t fint)

{
  uint32_t uVar1;
  anon_union_4_2_947300a4 v;
  
  uVar1 = 0;
  if (0.0 <= (float)fint) {
    uVar1 = (uint32_t)(long)(float)fint;
    if ((fint & 0x7fffffff) == 0x7f800000) {
      uVar1 = 0xffffffff;
    }
    if (4.2949673e+09 < (float)fint) {
      uVar1 = 0xffffffff;
    }
  }
  return uVar1;
}

Assistant:

static inline uint32_t
float_to_uint_int (uint32_t fint)
{
    union
    {
        uint32_t i;
        float    f;
    } v;
    v.i = fint;
    return float_to_uint (v.f);
}